

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O3

UBool __thiscall icu_63::UnifiedCache::_inProgress(UnifiedCache *this,UHashElement *element)

{
  u_atomic_int32_t *puVar1;
  u_atomic_int32_t *puVar2;
  int iVar3;
  int iVar4;
  SharedObject *pSVar5;
  SharedObject *pSVar6;
  
  pSVar5 = (SharedObject *)(element->value).pointer;
  iVar4 = *(int *)((long)(element->key).pointer + 8);
  if (pSVar5 != (SharedObject *)0x0) {
    puVar1 = &pSVar5->hardRefCount;
    LOCK();
    puVar2 = &pSVar5->hardRefCount;
    iVar3 = (puVar2->super___atomic_base<int>)._M_i;
    (puVar2->super___atomic_base<int>)._M_i = (puVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    if (iVar3 == 0) {
      this->fNumValuesInUse = this->fNumValuesInUse + 1;
    }
    pSVar6 = this->fNoValue;
    LOCK();
    (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if ((puVar1->super___atomic_base<int>)._M_i == 0) {
      this->fNumValuesInUse = this->fNumValuesInUse + -1;
    }
    return iVar4 == 0 && pSVar6 == pSVar5;
  }
  return iVar4 == 0 && this->fNoValue == (SharedObject *)0x0;
}

Assistant:

void UnifiedCache::_fetch(
        const UHashElement *element,
        const SharedObject *&value,
        UErrorCode &status) const {
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    status = theKey->fCreationStatus;

    // Since we have the cache lock, calling regular SharedObject add/removeRef
    // could cause us to deadlock on ourselves since they may need to lock
    // the cache mutex.
    removeHardRef(value);
    value = static_cast<const SharedObject *>(element->value.pointer);
    addHardRef(value);
}